

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

byte * __thiscall MD5::MD5::getDigest(MD5 *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  MD5 *this_00;
  EVP_PKEY_CTX local_50 [8];
  byte bits [8];
  bit32 oldState [4];
  
  if (this->finished == false) {
    this->finished = true;
    bits = *(byte (*) [8])this->state;
    uVar2 = *(undefined8 *)(this->state + 2);
    uVar1 = *(undefined8 *)this->count;
    encode(this,this->count,(byte *)local_50,8);
    init(this,(EVP_PKEY_CTX *)PADDING);
    this_00 = this;
    init(this,local_50);
    encode(this_00,this->state,this->digest,0x10);
    *(byte (*) [8])this->state = bits;
    *(undefined8 *)(this->state + 2) = uVar2;
    *(undefined8 *)this->count = uVar1;
  }
  return this->digest;
}

Assistant:

const byte* MD5::getDigest() {
  if (!finished) {
    finished = true;

    byte bits[8];
    bit32 oldState[4];
    bit32 oldCount[2];
    bit32 index, padLen;

    /* Save current state and count. */
    memcpy(oldState, state, 16);
    memcpy(oldCount, count, 8);

    /* Save number of bits */
    encode(count, bits, 8);

    /* Pad out to 56 mod 64. */
    index = (bit32)((count[0] >> 3) & 0x3f);
    padLen = (index < 56) ? (56 - index) : (120 - index);
    init(PADDING, padLen);

    /* Append length (before padding) */
    init(bits, 8);

    /* Store state in digest */
    encode(state, digest, 16);

    /* Restore current state and count. */
    memcpy(state, oldState, 16);
    memcpy(count, oldCount, 8);
  }
  return digest;
}